

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.h
# Opt level: O2

void __thiscall spvtools::opt::FoldingRules::FoldingRules(FoldingRules *this,IRContext *ctx)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_FoldingRules = (_func_int **)&PTR__FoldingRules_008af578;
  (this->rules_)._M_h._M_buckets = &(this->rules_)._M_h._M_single_bucket;
  (this->rules_)._M_h._M_bucket_count = 1;
  (this->rules_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rules_)._M_h._M_element_count = 0;
  (this->rules_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rules_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rules_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ext_rules_)._M_t._M_impl.super__Rb_tree_header;
  (this->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ext_rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->context_ = ctx;
  (this->empty_vector_).
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->empty_vector_).
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->empty_vector_).
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit FoldingRules(IRContext* ctx) : context_(ctx) {}